

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_system_linux.c
# Opt level: O0

int os_system_linux_linux_get_ioctl_fd(int af_type)

{
  undefined4 local_c;
  int af_type_local;
  
  if (af_type == 2) {
    local_c = _ioctl_v4;
  }
  else if (af_type == 10) {
    local_c = _ioctl_v6;
  }
  else {
    local_c = -1;
  }
  return local_c;
}

Assistant:

int
os_system_linux_linux_get_ioctl_fd(int af_type) {
  switch (af_type) {
    case AF_INET:
      return _ioctl_v4;
    case AF_INET6:
      return _ioctl_v6;
    default:
      return -1;
  }
}